

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# finders.c
# Opt level: O2

int getMineshafts(int mc,uint64_t seed,int cx0,int cz0,int cx1,int cz1,Pos *out,int nout)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  long lVar8;
  double dVar9;
  uint64_t s;
  uint local_88;
  uint local_84;
  int local_80;
  int local_7c;
  long local_78;
  ulong local_70;
  long local_68;
  uint64_t local_60;
  long local_58;
  long local_50;
  uint64_t local_48;
  uint64_t local_40;
  ulong local_38;
  
  s = seed & 0xffffffffffff ^ 0x5deece66d;
  local_7c = mc;
  local_40 = seed;
  local_60 = nextLong(&s);
  local_48 = nextLong(&s);
  local_68 = (long)cz0;
  local_50 = (long)cx0;
  local_58 = (long)cx1;
  local_80 = cz0 << 4;
  local_84 = -cz0;
  local_70 = local_48 * local_68;
  iVar6 = 0;
  do {
    if (local_58 < local_50) {
      return iVar6;
    }
    local_38 = local_60 * local_50;
    uVar2 = (uint)local_50;
    local_88 = -uVar2;
    if (0 < (int)uVar2) {
      local_88 = uVar2;
    }
    uVar4 = local_70;
    uVar3 = local_84;
    iVar5 = local_80;
    for (lVar8 = local_68; lVar8 <= cz1; lVar8 = lVar8 + 1) {
      s = (local_38 ^ uVar4 ^ local_40) & 0xffffffffffff ^ 0x5deece66d;
      local_78 = (long)iVar6;
      if (local_7c < 0x10) {
        skipNextN(&s,1);
        dVar9 = nextDouble(&s);
        if (dVar9 < 0.004) {
          uVar7 = local_88;
          if ((int)local_88 < (int)(uint)lVar8) {
            uVar7 = (uint)lVar8;
          }
          if ((int)uVar7 <= (int)uVar3) {
            uVar7 = uVar3;
          }
          if ((0x4f < uVar7) || (iVar1 = nextInt(&s,0x50), iVar1 < (int)uVar7)) {
            if (iVar6 < nout && out != (Pos *)0x0) {
              out[local_78].x = uVar2 << 4;
              out[local_78].z = iVar5;
            }
            goto LAB_001069c0;
          }
        }
      }
      else {
        dVar9 = nextDouble(&s);
        if (dVar9 < 0.004) {
          if (iVar6 < nout && out != (Pos *)0x0) {
            out[local_78].x = uVar2 << 4;
            out[local_78].z = iVar5;
          }
LAB_001069c0:
          iVar6 = iVar6 + 1;
        }
      }
      iVar5 = iVar5 + 0x10;
      uVar3 = uVar3 - 1;
      uVar4 = uVar4 + local_48;
    }
    local_50 = local_50 + 1;
  } while( true );
}

Assistant:

int getMineshafts(int mc, uint64_t seed, int cx0, int cz0, int cx1, int cz1,
        Pos *out, int nout)
{
    uint64_t s;
    setSeed(&s, seed);
    uint64_t a = nextLong(&s);
    uint64_t b = nextLong(&s);
    int i, j;
    int n = 0;

    for (i = cx0; i <= cx1; i++)
    {
        uint64_t aix = i * a ^ seed;

        for (j = cz0; j <= cz1; j++)
        {
            setSeed(&s, aix ^ j * b);

            if (mc >= MC_1_13)
            {
                if unlikely(nextDouble(&s) < 0.004)
                {
                    if (out && n < nout)
                    {
                        out[n].x = i * 16;
                        out[n].z = j * 16;
                    }
                    n++;
                }
            }
            else
            {
                skipNextN(&s, 1);
                if unlikely(nextDouble(&s) < 0.004)
                {
                    int d = i;
                    if (-i > d) d = -i;
                    if (+j > d) d = +j;
                    if (-j > d) d = -j;
                    if (d >= 80 || nextInt(&s, 80) < d)
                    {
                        if (out && n < nout)
                        {
                            out[n].x = i * 16;
                            out[n].z = j * 16;
                        }
                        n++;
                    }
                }
            }
        }
    }